

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  ScopedElement e;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.used = false;
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"OverallResult","");
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00,(int)local_60 + 0x10);
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"success","");
  XmlWriter::writeAttribute
            ((XmlWriter *)local_80._0_8_,(string *)(local_60 + 0x10),
             (testCaseStats->totals).assertions.failed == 0);
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    local_50._M_allocated_capacity = (size_type)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_60 + 0x10),"durationInSeconds","");
    lVar2 = std::chrono::_V2::system_clock::now();
    local_80._16_8_ = (double)((lVar2 - (this->m_testCaseTimer).m_nanoseconds) / 1000) / 1000000.0;
    XmlWriter::writeAttribute<double>
              ((XmlWriter *)local_80._0_8_,(string *)(local_60 + 0x10),(double *)(local_80 + 0x10));
    if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    local_50._M_allocated_capacity = (size_type)local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"StdOut","");
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)this_00,(int)local_60 + 0x10);
    trim((string *)(local_80 + 0x10),&testCaseStats->stdOut);
    XmlWriter::writeText((XmlWriter *)local_90._0_8_,(string *)(local_80 + 0x10),Newline);
    if ((pointer)local_80._16_8_ != (pointer)local_60) {
      operator_delete((void *)local_80._16_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
    if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    local_50._M_allocated_capacity = (size_type)local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"StdErr","");
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)this_00,(int)local_60 + 0x10);
    trim((string *)(local_80 + 0x10),&testCaseStats->stdErr);
    XmlWriter::writeText((XmlWriter *)local_90._0_8_,(string *)(local_80 + 0x10),Newline);
    if ((pointer)local_80._16_8_ != (pointer)local_60) {
      operator_delete((void *)local_80._16_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
    if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }